

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pCVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  DNA *__x;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  pointer pCVar10;
  pointer pbVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<Teacher> __l_00;
  initializer_list<Room> __l_01;
  initializer_list<Subject> __l_02;
  initializer_list<Group> __l_03;
  allocator<char> local_6bf;
  allocator<char> local_6be;
  allocator_type local_6bd;
  allocator<char> local_6bc;
  allocator_type local_6bb;
  allocator<char> local_6ba;
  allocator<char> local_6b9;
  vector<Teacher,_std::allocator<Teacher>_> teachers;
  vector<Subject,_std::allocator<Subject>_> subjects;
  pointer local_680;
  size_type local_678;
  char local_670 [8];
  undefined8 uStack_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  pointer local_640;
  undefined8 local_638;
  undefined1 local_630 [16];
  Group *local_620;
  undefined8 local_618;
  undefined1 local_610 [16];
  char *local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  pointer pSStack_5e8;
  pointer local_5e0;
  pointer local_5d8;
  undefined1 local_5d0 [16];
  _Base_ptr local_5c0;
  _Base_ptr local_5b8;
  undefined1 local_5b0 [16];
  DataStorage *local_5a0;
  pointer local_598;
  undefined1 local_590 [32];
  vector<Group,_std::allocator<Group>_> groups;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  vector<Room,_std::allocator<Room>_> rooms;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  schedule;
  vector<Subject,_std::allocator<Subject>_> local_4f8;
  vector<Subject,_std::allocator<Subject>_> local_4e0;
  vector<Subject,_std::allocator<Subject>_> local_4c8;
  vector<Teacher,_std::allocator<Teacher>_> local_4b0;
  vector<Teacher,_std::allocator<Teacher>_> local_498;
  vector<Teacher,_std::allocator<Teacher>_> local_480;
  vector<Teacher,_std::allocator<Teacher>_> local_468;
  vector<Teacher,_std::allocator<Teacher>_> local_450;
  vector<Teacher,_std::allocator<Teacher>_> local_438;
  vector<Teacher,_std::allocator<Teacher>_> local_420;
  vector<Teacher,_std::allocator<Teacher>_> local_408;
  vector<Teacher,_std::allocator<Teacher>_> local_3f0;
  Population population;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined1 local_348 [32];
  undefined1 local_328 [24];
  undefined8 local_310;
  undefined1 local_308 [8];
  undefined8 uStack_300;
  Subject local_2f8;
  Subject local_2c0;
  Subject local_288;
  Subject local_250;
  Subject local_218;
  DataStorage data;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&population,"Monday",(allocator<char> *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&population.mutationRate_,"Tuesday",(allocator<char> *)&schedule);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             ((long)&population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header + 8),
             "Wednesday",(allocator<char> *)&teachers);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&population.answer.fitness,"Thursday",(allocator<char> *)&rooms);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_368 + 0x10),"Friday",(allocator<char> *)&subjects);
  __l._M_len = 5;
  __l._M_array = (iterator)&population;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&days,__l,(allocator_type *)&groups);
  lVar8 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&population.data_ + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"Merk",(allocator<char> *)&data);
  population.data_ =
       (DataStorage *)
       &population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
        super__Vector_impl_data._M_finish;
  if (local_5a0 == (DataStorage *)local_590) {
    population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_590._8_8_;
  }
  else {
    population.data_ = local_5a0;
  }
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)((ulong)(uint7)local_590._1_7_ << 8);
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_start = local_598;
  local_598 = (pointer)0x0;
  local_590[0] = 0;
  local_5a0 = (DataStorage *)local_590;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"Margo",(allocator<char> *)&schedule);
  population.mutationRate_ = (double)&population.answer;
  if (local_5c0 == (_Base_ptr)local_5b0) {
    population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_5b0._8_8_;
  }
  else {
    population.mutationRate_ = (double)local_5c0;
  }
  population.answer.schedule.schedule._M_t._M_impl._0_8_ = (ulong)(uint7)local_5b0._1_7_ << 8;
  population._40_8_ = local_5b8;
  local_5b8 = (_Base_ptr)0x0;
  local_5b0[0] = 0;
  local_5c0 = (_Base_ptr)local_5b0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"Fish",(allocator<char> *)&rooms);
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((long)&population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header + 0x18);
  if (local_5e0 == (pointer)local_5d0) {
    population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_5d0._8_8_;
  }
  else {
    population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_5e0;
  }
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)((ulong)(uint7)local_5d0._1_7_ << 8);
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_5d8;
  local_5d8 = (pointer)0x0;
  local_5d0[0] = _S_red;
  local_5e0 = (pointer)local_5d0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"Roma",(allocator<char> *)&subjects);
  if (local_600 == local_5f8._M_local_buf + 8) {
    local_368._8_8_ = pSStack_5e8;
    population.answer.fitness = (double)local_368;
  }
  else {
    population.answer.fitness = (double)local_600;
  }
  local_5f8._M_allocated_capacity = 0;
  local_5f8._M_local_buf[8] = '\0';
  local_600 = local_5f8._M_local_buf + 8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_630 + 0x10),"Pokemon",(allocator<char> *)&groups);
  if (local_620 == (Group *)local_610) {
    local_348._8_8_ = local_610._8_8_;
    local_358._M_allocated_capacity = (size_type)(Group *)(local_368 + 0x20);
  }
  else {
    local_358._M_allocated_capacity = (size_type)local_620;
  }
  local_358._8_8_ = local_618;
  local_618 = 0;
  local_610[0] = 0;
  local_620 = (Group *)local_610;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_650 + 0x10),"Biba",&local_6be)
  ;
  local_348._16_8_ = local_348 + 0x20;
  if (local_640 == (pointer)(local_650 + 0x20)) {
    local_328._8_8_ = local_630._8_8_;
  }
  else {
    local_348._16_8_ = local_640;
  }
  local_348._24_8_ = local_638;
  local_638 = 0;
  local_630[0] = 0;
  local_640 = (pointer)(local_650 + 0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"Nika",&local_6bf);
  local_328._16_8_ = local_308;
  if (local_660 == local_650) {
    uStack_300 = uStack_648;
  }
  else {
    local_328._16_8_ = local_660;
  }
  local_310 = local_658;
  local_658 = 0;
  local_650[0] = 0;
  local_660 = local_650;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"Vlad",&local_6bc);
  local_2f8.name._M_dataplus._M_p = (pointer)((long)&local_2f8 + 0x10);
  if (local_680 == local_670) {
    local_2f8.name.field_2._8_8_ = uStack_668;
  }
  else {
    local_2f8.name._M_dataplus._M_p = local_680;
  }
  local_2f8.name._M_string_length = local_678;
  local_678 = 0;
  local_670[0] = 0;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&population;
  local_680 = local_670;
  std::vector<Teacher,_std::allocator<Teacher>_>::vector(&teachers,__l_00,&local_6bd);
  lVar8 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&population.data_ + lVar8));
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != -0x20);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)(local_650 + 0x10));
  std::__cxx11::string::~string((string *)(local_630 + 0x10));
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  population.data_ = (DataStorage *)CONCAT44(population.data_._4_4_,0xd7);
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1e;
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,0x1f9);
  population.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x23;
  population.mutationRate_ = (double)CONCAT44(population.mutationRate_._4_4_,1);
  population.answerReady = true;
  population._41_7_ = 0;
  population.answer.schedule.schedule._M_t._M_impl._0_4_ = 0x27;
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 100;
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       CONCAT44(population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent._4_4_,0x12f);
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x19;
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)
       CONCAT44(population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_right._4_4_,0x1b);
  population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x23;
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)&population;
  std::vector<Room,_std::allocator<Room>_>::vector(&rooms,__l_01,(allocator_type *)&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Algebra",(allocator<char> *)&data);
  GetRandomSubsetOfTeachers(&local_3f0,&teachers);
  Subject::Subject((Subject *)&population,&local_50,&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Geometry",(allocator<char> *)&schedule);
  GetRandomSubsetOfTeachers(&local_408,&teachers);
  Subject::Subject((Subject *)
                   &population.answer.schedule.schedule._M_t._M_impl.super__Rb_tree_header,&local_70
                   ,&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Programming",(allocator<char> *)&groups);
  GetRandomSubsetOfTeachers(&local_420,&teachers);
  Subject::Subject((Subject *)local_368,&local_90,&local_420);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Discrete Math",&local_6be)
  ;
  GetRandomSubsetOfTeachers(&local_438,&teachers);
  Subject::Subject((Subject *)(local_348 + 0x18),&local_b0,&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"DataStorage science",&local_6bf);
  GetRandomSubsetOfTeachers(&local_450,&teachers);
  Subject::Subject(&local_2f8,&local_d0,&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"DataStorage structures",&local_6bc);
  GetRandomSubsetOfTeachers(&local_468,&teachers);
  Subject::Subject(&local_2c0,&local_f0,&local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Math Anal.",(allocator<char> *)&local_6bd);
  GetRandomSubsetOfTeachers(&local_480,&teachers);
  Subject::Subject(&local_288,&local_110,&local_480);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Prob. Th.",&local_6b9);
  GetRandomSubsetOfTeachers(&local_498,&teachers);
  Subject::Subject(&local_250,&local_130,&local_498);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Algorithms",&local_6ba);
  GetRandomSubsetOfTeachers(&local_4b0,&teachers);
  Subject::Subject(&local_218,&local_150,&local_4b0);
  __l_02._M_len = 9;
  __l_02._M_array = (iterator)&population;
  std::vector<Subject,_std::allocator<Subject>_>::vector(&subjects,__l_02,&local_6bb);
  lVar8 = 0x1c0;
  do {
    Subject::~Subject((Subject *)((long)&population.data_ + lVar8));
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != -0x38);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_4b0);
  std::__cxx11::string::~string((string *)&local_150);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_498);
  std::__cxx11::string::~string((string *)&local_130);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_480);
  std::__cxx11::string::~string((string *)&local_110);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_468);
  std::__cxx11::string::~string((string *)&local_f0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_450);
  std::__cxx11::string::~string((string *)&local_d0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_438);
  std::__cxx11::string::~string((string *)&local_b0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_420);
  std::__cxx11::string::~string((string *)&local_90);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_408);
  std::__cxx11::string::~string((string *)&local_70);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3f0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"TTP-42",(allocator<char> *)&data);
  GetRandomSubsetOfSubjects(&local_4c8,&subjects);
  Group::Group((Group *)&population,&local_170,&local_4c8,0x14);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"TTP-41",(allocator<char> *)&schedule);
  GetRandomSubsetOfSubjects(&local_4e0,&subjects);
  Group::Group((Group *)((long)&population.answer.schedule.schedule._M_t._M_impl.
                                super__Rb_tree_header + 0x10),&local_190,&local_4e0,0x1e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"MI-4",&local_6be);
  GetRandomSubsetOfSubjects(&local_4f8,&subjects);
  Group::Group((Group *)(local_368 + 0x20),&local_1b0,&local_4f8,0x1a);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&population;
  std::vector<Group,_std::allocator<Group>_>::vector(&groups,__l_03,(allocator_type *)&local_6bf);
  lVar8 = 0x90;
  do {
    Group::~Group((Group *)((long)&population.data_ + lVar8));
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_4f8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_4e0);
  std::__cxx11::string::~string((string *)&local_190);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_4c8);
  std::__cxx11::string::~string((string *)&local_170);
  data.days = &days;
  data.LESSONS_PER_DAY = 4;
  data.groups = &groups;
  data.subjects = &subjects;
  data.rooms = &rooms;
  data.teachers = &teachers;
  Population::Population(&population,&data,0.02,0x32);
  uVar9 = 1;
  uVar7 = 0;
  while( true ) {
    bVar3 = Population::AnswerReady(&population);
    if (bVar3 || 4999999 < uVar7) break;
    Population::evolve(&population);
    if ((uVar9 / 100) * 100 - 1 == uVar7) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7 + 1);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    uVar9 = uVar9 + 1;
    uVar7 = uVar7 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"population size = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cout,"mutation rate = ");
  poVar4 = std::ostream::_M_insert<double>(0.02);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"iterations = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar7);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"answer is ready = ");
  Population::AnswerReady(&population);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n\n\n");
  __x = Population::GetAnswer(&population);
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::_Rb_tree(&schedule._M_t,
             (_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
              *)__x);
  std::operator<<((ostream *)&std::cout,"=================================\n");
  local_590._16_8_ =
       days.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = days.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar11 != (pointer)local_590._16_8_) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[Day: ");
    poVar4 = std::operator<<(poVar4,(string *)pbVar11);
    std::operator<<(poVar4,"]\n");
    local_590._24_8_ = pbVar11;
    for (p_Var6 = schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        uVar2 = local_590._24_8_,
        (_Rb_tree_header *)p_Var6 != &schedule._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                             *)&p_Var6[3]._M_parent,(key_type *)local_590._24_8_);
      poVar4 = std::operator<<((ostream *)&std::cout,"  Group: ");
      poVar4 = std::operator<<(poVar4,(string *)&p_Var6[1]._M_parent);
      std::operator<<(poVar4,"\n");
      pCVar1 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar10 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                     super__Vector_impl_data._M_start; pCVar10 != pCVar1; pCVar10 = pCVar10 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"  ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,")\n");
        poVar4 = std::operator<<((ostream *)&std::cout,"  room = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(pCVar10->room).number);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::cout,"  lesson = ");
        poVar4 = std::operator<<(poVar4,(string *)&pCVar10->subject);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&std::cout,"  teacher = ");
        poVar4 = std::operator<<(poVar4,(string *)&pCVar10->teacher);
        std::operator<<(poVar4,"\n");
      }
      std::operator<<((ostream *)&std::cout,"  --------------------\n");
    }
    std::operator<<((ostream *)&std::cout,"=================================\n");
    pbVar11 = (pointer)(uVar2 + 0x20);
  }
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~_Rb_tree(&schedule._M_t);
  Population::~Population(&population);
  std::vector<Group,_std::allocator<Group>_>::~vector(&groups);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&subjects);
  std::_Vector_base<Room,_std::allocator<Room>_>::~_Vector_base
            (&rooms.super__Vector_base<Room,_std::allocator<Room>_>);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&teachers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&days);
  return 0;
}

Assistant:

int main() {
    vector<Day> days = {"Monday", "Tuesday", "Wednesday", "Thursday", "Friday"}; // 5
    vector<Teacher> teachers = {
            Teacher("Merk"),
            Teacher("Margo"),
            Teacher("Fish"),
            Teacher("Roma"),
            Teacher("Pokemon"),
            Teacher("Biba"),
            Teacher("Nika"),
            Teacher("Vlad"),
    }; // 8
    vector<Room> rooms = {
            Room(215, 30),
            Room(505, 35),
            Room(1, 27),
            Room(39, 100),
            Room(303, 25),
            Room(27, 35),
    }; // 6
    vector<Subject> subjects = {
            Subject("Algebra", GetRandomSubsetOfTeachers(teachers)),
            Subject("Geometry", GetRandomSubsetOfTeachers(teachers)),
            Subject("Programming", GetRandomSubsetOfTeachers(teachers)),
            Subject("Discrete Math", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage science", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage structures", GetRandomSubsetOfTeachers(teachers)),
            Subject("Math Anal.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Prob. Th.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Algorithms", GetRandomSubsetOfTeachers(teachers)),
    }; // 9
    vector<Group> groups = {
            Group("TTP-42", GetRandomSubsetOfSubjects(subjects), 20),
            Group("TTP-41", GetRandomSubsetOfSubjects(subjects), 30),
            Group("MI-4", GetRandomSubsetOfSubjects(subjects), 26),
    };

    DataStorage data(groups, subjects, rooms, teachers, days, LESSONS_PER_DAY);

    Population population(data, MUTATION_RATE, POPULATION_SIZE);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < EVOLUTION_MAX_ITERATIONS) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << endl;
        }
    }

    cout << "population size = " << POPULATION_SIZE << "\n";
    cout << "mutation rate = " << MUTATION_RATE << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n\n\n";

    auto schedule = population.GetAnswer().schedule.schedule;

    cout << "=================================\n";

    for (const Day& mainDay : days) {
        cout << "[Day: " << mainDay << "]\n";

        for (auto&[group, schedulePerGroup] : schedule) {
            auto& listOfClasses = schedulePerGroup[mainDay];
            cout << "  Group: " << group.name << "\n";
            for (Class& class_ : listOfClasses) {
                cout << "  " << class_.time.number + 1 << ")\n";
                cout << "  room = " << class_.room.number << "\n";
                cout << "  lesson = " << class_.subject.name << "\n";
                cout << "  teacher = " << class_.teacher.name << "\n";
            }
            cout << "  --------------------\n";
        }
        cout << "=================================\n";
    }

    return 0;
}